

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode XXH64_update(XXH64_state_t *state,void *input,size_t len)

{
  ulong uVar1;
  xxh_u64 xVar2;
  xxh_u64 xVar3;
  void *pvVar4;
  void *pvVar5;
  long in_RDX;
  ulong in_RSI;
  long *in_RDI;
  xxh_u64 v4;
  xxh_u64 v3;
  xxh_u64 v2;
  xxh_u64 v1;
  xxh_u8 *limit;
  xxh_u8 *bEnd;
  xxh_u8 *p;
  size_t in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  void *local_58;
  void *local_50;
  xxh_u64 local_48;
  xxh_u64 local_40;
  ulong local_28;
  XXH_errorcode local_4;
  
  if (in_RSI == 0) {
    local_4 = XXH_ERROR;
  }
  else {
    uVar1 = in_RSI + in_RDX;
    *in_RDI = in_RDX + *in_RDI;
    if ((ulong)*(uint *)(in_RDI + 9) + in_RDX < 0x20) {
      XXH_memcpy(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      *(int *)(in_RDI + 9) = (int)in_RDX + (int)in_RDI[9];
      local_4 = XXH_OK;
    }
    else {
      local_48 = in_stack_ffffffffffffff70;
      local_50 = in_stack_ffffffffffffff78;
      local_58 = in_stack_ffffffffffffff80;
      local_28 = in_RSI;
      if ((int)in_RDI[9] != 0) {
        XXH_memcpy(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        xVar3 = in_RDI[1];
        xVar2 = XXH_readLE64((void *)0x2c639c);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[1] = xVar3;
        xVar3 = in_RDI[2];
        xVar2 = XXH_readLE64((void *)0x2c63de);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[2] = xVar3;
        xVar3 = in_RDI[3];
        xVar2 = XXH_readLE64((void *)0x2c6420);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[3] = xVar3;
        xVar3 = in_RDI[4];
        xVar2 = XXH_readLE64((void *)0x2c6462);
        xVar3 = XXH64_round(xVar3,xVar2);
        in_RDI[4] = xVar3;
        local_28 = in_RSI + (0x20 - (int)in_RDI[9]);
        *(undefined4 *)(in_RDI + 9) = 0;
        local_48 = in_stack_ffffffffffffff70;
        local_50 = in_stack_ffffffffffffff78;
        local_58 = in_stack_ffffffffffffff80;
      }
      if (local_28 + 0x20 <= uVar1) {
        local_40 = in_RDI[1];
        pvVar5 = (void *)in_RDI[4];
        pvVar4 = (void *)in_RDI[3];
        xVar3 = in_RDI[2];
        do {
          local_48 = xVar3;
          local_50 = pvVar4;
          local_58 = pvVar5;
          xVar3 = XXH_readLE64((void *)0x2c6525);
          local_40 = XXH64_round(local_40,xVar3);
          xVar3 = XXH_readLE64((void *)0x2c6558);
          xVar3 = XXH64_round(local_48,xVar3);
          xVar2 = XXH_readLE64((void *)0x2c658c);
          pvVar4 = (void *)XXH64_round((xxh_u64)local_50,xVar2);
          xVar2 = XXH_readLE64((void *)0x2c65c0);
          pvVar5 = (void *)XXH64_round((xxh_u64)local_58,xVar2);
          local_28 = local_28 + 0x20;
        } while (local_28 <= uVar1 - 0x20);
        in_RDI[1] = local_40;
        in_RDI[2] = xVar3;
        in_RDI[3] = (long)pvVar4;
        in_RDI[4] = (long)pvVar5;
      }
      if (local_28 < uVar1) {
        XXH_memcpy(local_58,local_50,local_48);
        *(int *)(in_RDI + 9) = (int)uVar1 - (int)local_28;
      }
      local_4 = XXH_OK;
    }
  }
  return local_4;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH64_update (XXH64_state_t* state, const void* input, size_t len)
{
    if (input==NULL)
#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && (XXH_ACCEPT_NULL_INPUT_POINTER>=1)
        return XXH_OK;
#else
        return XXH_ERROR;
#endif

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len += len;

        if (state->memsize + len < 32) {  /* fill in tmp buffer */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, len);
            state->memsize += (xxh_u32)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* tmp buffer is full */
            XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, 32-state->memsize);
            state->v1 = XXH64_round(state->v1, XXH_readLE64(state->mem64+0));
            state->v2 = XXH64_round(state->v2, XXH_readLE64(state->mem64+1));
            state->v3 = XXH64_round(state->v3, XXH_readLE64(state->mem64+2));
            state->v4 = XXH64_round(state->v4, XXH_readLE64(state->mem64+3));
            p += 32 - state->memsize;
            state->memsize = 0;
        }

        if (p+32 <= bEnd) {
            const xxh_u8* const limit = bEnd - 32;
            xxh_u64 v1 = state->v1;
            xxh_u64 v2 = state->v2;
            xxh_u64 v3 = state->v3;
            xxh_u64 v4 = state->v4;

            do {
                v1 = XXH64_round(v1, XXH_readLE64(p)); p+=8;
                v2 = XXH64_round(v2, XXH_readLE64(p)); p+=8;
                v3 = XXH64_round(v3, XXH_readLE64(p)); p+=8;
                v4 = XXH64_round(v4, XXH_readLE64(p)); p+=8;
            } while (p<=limit);

            state->v1 = v1;
            state->v2 = v2;
            state->v3 = v3;
            state->v4 = v4;
        }

        if (p < bEnd) {
            XXH_memcpy(state->mem64, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}